

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall NavierStokesBase::velocity_advection(NavierStokesBase *this,Real dt)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  IntVect *pIVar1;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  bool bVar2;
  int k_1;
  int iVar3;
  ostream *poVar4;
  MultiFab *dst;
  NavierStokesBase *this_01;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int j;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  NavierStokesBase *pNVar13;
  string *this_02;
  long lVar14;
  int k;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int j_1;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  Real time;
  double dVar27;
  FabArray<amrex::FArrayBox> *local_ae0;
  Box force_bx;
  Array4<double> local_9f8;
  Box state_bx;
  int local_998;
  int local_994;
  int local_990;
  MFIter U_mfi_1;
  Array4<const_double> local_918;
  MFIter U_mfi;
  FillPatchIterator U_fpi;
  MultiFab visc_terms;
  MultiFab forcing_term;
  FillPatchIterator Rho_fpi;
  
  if (verbose != 0) {
    if (do_mom_diff == 0) {
      poVar4 = amrex::OutStream();
      amrex::Print::Print((Print *)&U_fpi,poVar4);
      std::operator<<((ostream *)&U_fpi.super_MFIter.tile_size,"... advect velocities\n");
    }
    else {
      poVar4 = amrex::OutStream();
      amrex::Print::Print((Print *)&U_fpi,poVar4);
      std::operator<<((ostream *)&U_fpi.super_MFIter.tile_size,"... advect momenta\n");
    }
    amrex::Print::~Print((Print *)&U_fpi);
  }
  pNVar13 = (NavierStokesBase *)
            (this->super_AmrLevel).state.
            super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
            super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
            super__Vector_impl_data._M_start;
  time = amrex::StateData::prevTime((StateData *)pNVar13);
  iVar3 = nghost_force(pNVar13);
  pNVar13 = this;
  dst = getDivCond(this,iVar3,time);
  bxs = &(this->super_AmrLevel).grids;
  dm = &(this->super_AmrLevel).dmap;
  iVar3 = nghost_force(pNVar13);
  U_fpi.super_MFIter.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  U_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
  U_fpi.super_MFIter.tile_size.vect[0] = 0;
  U_fpi.super_MFIter.tile_size.vect[1] = 0;
  U_fpi.super_MFIter.tile_size.vect[2] = 0;
  U_fpi.super_MFIter.flags = '\0';
  U_fpi.super_MFIter._29_3_ = 0;
  U_fpi.super_MFIter.currentIndex = 0;
  U_fpi.super_MFIter.beginIndex = 0;
  amrex::MultiFab::MultiFab
            (&forcing_term,bxs,dm,3,iVar3,(MFInfo *)&U_fpi,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&U_fpi.super_MFIter.tile_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&forcing_term.super_FabArray<amrex::FArrayBox>,0.0);
  iVar3 = nghost_state(this);
  amrex::FillPatchIterator::FillPatchIterator
            (&U_fpi,&this->super_AmrLevel,&forcing_term,iVar3,time,0,0,3);
  local_ae0 = &U_fpi.m_fabs.super_FabArray<amrex::FArrayBox>;
  if (do_mom_diff != 0) {
    local_ae0 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    iVar3 = nghost_state(this);
    Rho_fpi.super_MFIter.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    Rho_fpi.super_MFIter.fabArray = (FabArrayBase *)0x0;
    Rho_fpi.super_MFIter.tile_size.vect[0] = 0;
    Rho_fpi.super_MFIter.tile_size.vect[1] = 0;
    Rho_fpi.super_MFIter.tile_size.vect[2] = 0;
    Rho_fpi.super_MFIter.flags = '\0';
    Rho_fpi.super_MFIter._29_3_ = 0;
    Rho_fpi.super_MFIter.currentIndex = 0;
    Rho_fpi.super_MFIter.beginIndex = 0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)local_ae0,bxs,dm,3,iVar3,(MFInfo *)&Rho_fpi,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&Rho_fpi.super_MFIter.tile_size);
    if (do_mom_diff != 0) {
      iVar3 = nghost_state(this);
      amrex::FillPatchIterator::FillPatchIterator
                (&Rho_fpi,&this->super_AmrLevel,&forcing_term,iVar3,time,0,3,1);
      amrex::MFIter::MFIter(&U_mfi,(FabArrayBase *)&U_fpi.m_fabs,true);
      while( true ) {
        if (U_mfi.endIndex <= U_mfi.currentIndex) break;
        iVar3 = nghost_state(this);
        amrex::MFIter::growntilebox(&state_bx,&U_mfi,iVar3);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&visc_terms,
                   &Rho_fpi.m_fabs.super_FabArray<amrex::FArrayBox>,&U_mfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&U_mfi_1,&U_fpi.m_fabs.super_FabArray<amrex::FArrayBox>,
                   &U_mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_9f8,local_ae0,&U_mfi);
        lVar23 = (long)state_bx.smallend.vect[1];
        lVar9 = (long)state_bx.smallend.vect[2];
        lVar18 = (long)state_bx.smallend.vect[0];
        lVar15 = (lVar23 - local_9f8.begin.y) * local_9f8.jstride * 8 +
                 (lVar9 - local_9f8.begin.z) * local_9f8.kstride * 8 + lVar18 * 8 +
                 (long)local_9f8.begin.x * -8 + (long)local_9f8.p;
        lVar11 = (lVar23 - U_mfi_1.beginIndex) * (long)U_mfi_1.fabArray * 8 +
                 (lVar9 - U_mfi_1.endIndex) * U_mfi_1.tile_size.vect._0_8_ * 8 + lVar18 * 8 +
                 (long)U_mfi_1.currentIndex * -8 +
                 (long)U_mfi_1.m_fa._M_t.
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
        for (lVar7 = 0; lVar16 = lVar9, lVar19 = lVar15,
            lVar20 = (lVar23 - visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                               boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
                     visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                     _0_8_ * 8 +
                     (lVar9 - visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                              boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
                     visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                     m_op._4_8_ * 8 + lVar18 * 8 +
                     (long)visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                           m_bat.m_op.m_bndryReg.m_loshft.vect[0] * -8 +
                     (long)visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                           _vptr_FabArrayBase, lVar6 = lVar11, lVar7 != 3; lVar7 = lVar7 + 1) {
          for (; lVar10 = lVar23, lVar17 = lVar19, lVar22 = lVar20, lVar25 = lVar6,
              lVar16 <= state_bx.bigend.vect[2]; lVar16 = lVar16 + 1) {
            for (; lVar10 <= state_bx.bigend.vect[1]; lVar10 = lVar10 + 1) {
              if (state_bx.smallend.vect[0] <= state_bx.bigend.vect[0]) {
                lVar12 = 0;
                do {
                  *(double *)(lVar17 + lVar12 * 8) =
                       *(double *)(lVar25 + lVar12 * 8) * *(double *)(lVar22 + lVar12 * 8);
                  lVar12 = lVar12 + 1;
                } while ((state_bx.bigend.vect[0] - state_bx.smallend.vect[0]) + 1 != (int)lVar12);
              }
              lVar17 = lVar17 + local_9f8.jstride * 8;
              lVar22 = lVar22 + visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                                boxarray.m_bat._0_8_ * 8;
              lVar25 = lVar25 + (long)U_mfi_1.fabArray * 8;
            }
            lVar19 = lVar19 + local_9f8.kstride * 8;
            lVar20 = lVar20 + visc_terms.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                              boxarray.m_bat.m_op._4_8_ * 8;
            lVar6 = lVar6 + U_mfi_1.tile_size.vect._0_8_ * 8;
          }
          lVar15 = lVar15 + local_9f8.nstride * 8;
          lVar11 = lVar11 + U_mfi_1._24_8_ * 8;
        }
        amrex::MFIter::operator++(&U_mfi);
      }
      amrex::MFIter::~MFIter(&U_mfi);
      amrex::FillPatchIterator::~FillPatchIterator(&Rho_fpi);
    }
  }
  this_02 = &advection_scheme_abi_cxx11_;
  bVar2 = std::operator!=(&advection_scheme_abi_cxx11_,"MOL");
  if (bVar2) {
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_AmrLevel).state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[2].old_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    iVar3 = nghost_force((NavierStokesBase *)this_02);
    pNVar13 = (NavierStokesBase *)&Rho_fpi;
    amrex::FillPatchIterator::FillPatchIterator
              ((FillPatchIterator *)pNVar13,&this->super_AmrLevel,&forcing_term,iVar3,time,0,3,
               NUM_SCALARS);
    iVar3 = nghost_force(pNVar13);
    pNVar13 = this;
    this_01 = (NavierStokesBase *)getDsdt(this,iVar3,time);
    iVar3 = nghost_force(pNVar13);
    amrex::MultiFab::Saxpy(dst,dt * 0.5,(MultiFab *)this_01,0,0,1,iVar3);
    (*((FabArrayBase *)&(this_01->super_AmrLevel)._vptr_AmrLevel)->_vptr_FabArrayBase[1])();
    iVar3 = nghost_force(this_01);
    U_mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    U_mfi.fabArray = (FabArrayBase *)0x0;
    U_mfi.tile_size.vect[0] = 0;
    U_mfi.tile_size.vect[1] = 0;
    U_mfi.tile_size.vect[2] = 0;
    U_mfi.flags = '\0';
    U_mfi._29_3_ = 0;
    U_mfi.currentIndex = 0;
    U_mfi.beginIndex = 0;
    amrex::MultiFab::MultiFab
              (&visc_terms,bxs,dm,3,iVar3,(MFInfo *)&U_mfi,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&U_mfi.tile_size);
    if ((be_cn_theta != 1.0) || (NAN(be_cn_theta))) {
      (*(this->super_AmrLevel)._vptr_AmrLevel[0x33])(time,this,&visc_terms,0,3);
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&visc_terms.super_FabArray<amrex::FArrayBox>,0.0);
    }
    pNVar13 = (NavierStokesBase *)&U_mfi_1;
    amrex::MFIter::MFIter((MFIter *)pNVar13,(FabArrayBase *)&U_fpi.m_fabs,true);
    while( true ) {
      pIVar1 = &U_mfi.tile_size;
      if (U_mfi_1.endIndex <= U_mfi_1.currentIndex) break;
      iVar3 = nghost_force(pNVar13);
      amrex::MFIter::growntilebox(&force_bx,&U_mfi_1,iVar3);
      if (getForceVerbose != 0) {
        poVar4 = amrex::OutStream();
        amrex::Print::Print((Print *)&U_mfi,poVar4);
        std::operator<<((ostream *)pIVar1,"---");
        std::operator<<((ostream *)pIVar1,'\n');
        std::operator<<((ostream *)pIVar1,"B - velocity advection:");
        std::operator<<((ostream *)pIVar1,'\n');
        std::operator<<((ostream *)pIVar1,"Calling getForce...");
        std::operator<<((ostream *)pIVar1,'\n');
        amrex::Print::~Print((Print *)&U_mfi);
      }
      piVar5 = &U_mfi_1.currentIndex;
      if (U_mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar5 = ((U_mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + U_mfi_1.currentIndex;
      }
      iVar3 = *piVar5;
      (*(this->super_AmrLevel)._vptr_AmrLevel[0x2a])
                (time,this,
                 forcing_term.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[iVar3],&force_bx,0,3,
                 U_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[iVar3],
                 Rho_fpi.m_fabs.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[iVar3],0,&U_mfi_1);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&U_mfi,&forcing_term.super_FabArray<amrex::FArrayBox>,&U_mfi_1,0)
      ;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_9f8,&visc_terms.super_FabArray<amrex::FArrayBox>,
                 &U_mfi_1,0);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&state_bx,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&U_mfi_1);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_918,&Rho_fpi.m_fabs.super_FabArray<amrex::FArrayBox>,&U_mfi_1);
      iVar3 = do_mom_diff;
      lVar11 = (long)force_bx.smallend.vect[1];
      lVar23 = (long)force_bx.smallend.vect[2];
      lVar16 = (long)force_bx.smallend.vect[0];
      lVar19 = CONCAT44(state_bx.bigend.vect[2],state_bx.bigend.vect[1]) * 8;
      lVar7 = CONCAT44(state_bx.bigend.vect[0],state_bx.smallend.vect[2]) * 8;
      lVar9 = (lVar11 - local_994) * lVar7 + (lVar23 - local_990) * lVar19 + lVar16 * 8 +
              (long)local_998 * -8 + CONCAT44(state_bx.smallend.vect[1],state_bx.smallend.vect[0]);
      lVar20 = (lVar11 - local_9f8.begin.y) * local_9f8.jstride * 8 +
               (lVar23 - local_9f8.begin.z) * local_9f8.kstride * 8 + lVar16 * 8 +
               (long)local_9f8.begin.x * -8 + (long)local_9f8.p;
      lVar18 = (lVar11 - U_mfi.beginIndex) * (long)U_mfi.fabArray * 8 +
               (lVar23 - U_mfi.endIndex) * U_mfi.tile_size.vect._0_8_ * 8 + lVar16 * 8 +
               (long)U_mfi.currentIndex * -8 +
               (long)U_mfi.m_fa._M_t.
                     super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      for (lVar15 = 0; lVar6 = lVar23, lVar10 = lVar18, lVar17 = lVar20, lVar22 = lVar9,
          lVar25 = (lVar11 - local_918.begin.y) * local_918.jstride * 8 +
                   (lVar23 - local_918.begin.z) * local_918.kstride * 8 + lVar16 * 8 +
                   (long)local_918.begin.x * -8 + (long)local_918.p, lVar15 != 3;
          lVar15 = lVar15 + 1) {
        for (; lVar12 = lVar10, lVar14 = lVar17, lVar21 = lVar22, lVar24 = lVar11, lVar26 = lVar25,
            lVar6 <= force_bx.bigend.vect[2]; lVar6 = lVar6 + 1) {
          for (; lVar24 <= force_bx.bigend.vect[1]; lVar24 = lVar24 + 1) {
            if (force_bx.smallend.vect[0] <= force_bx.bigend.vect[0]) {
              lVar8 = 0;
              do {
                dVar27 = (*(double *)(lVar12 + lVar8 * 8) + *(double *)(lVar14 + lVar8 * 8)) -
                         *(double *)(lVar21 + lVar8 * 8);
                *(double *)(lVar12 + lVar8 * 8) = dVar27;
                if (iVar3 == 0) {
                  *(double *)(lVar12 + lVar8 * 8) = dVar27 / *(double *)(lVar26 + lVar8 * 8);
                }
                lVar8 = lVar8 + 1;
              } while ((force_bx.bigend.vect[0] - force_bx.smallend.vect[0]) + 1 != (int)lVar8);
            }
            lVar26 = lVar26 + local_918.jstride * 8;
            lVar21 = lVar21 + lVar7;
            lVar14 = lVar14 + local_9f8.jstride * 8;
            lVar12 = lVar12 + (long)U_mfi.fabArray * 8;
          }
          lVar10 = lVar10 + U_mfi.tile_size.vect._0_8_ * 8;
          lVar17 = lVar17 + local_9f8.kstride * 8;
          lVar22 = lVar22 + lVar19;
          lVar25 = lVar25 + local_918.kstride * 8;
        }
        lVar9 = lVar9 + stack0xfffffffffffff660 * 8;
        lVar20 = lVar20 + local_9f8.nstride * 8;
        lVar18 = lVar18 + U_mfi._24_8_ * 8;
      }
      pNVar13 = (NavierStokesBase *)&U_mfi_1;
      amrex::MFIter::operator++((MFIter *)pNVar13);
    }
    amrex::MFIter::~MFIter(&U_mfi_1);
    amrex::MultiFab::~MultiFab(&visc_terms);
    amrex::FillPatchIterator::~FillPatchIterator(&Rho_fpi);
  }
  ComputeAofs(this,0,3,(MultiFab *)local_ae0,0,&forcing_term,dst,true,dt);
  (*(dst->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])();
  if (do_mom_diff != 0) {
    (*(local_ae0->super_FabArrayBase)._vptr_FabArrayBase[1])();
  }
  amrex::FillPatchIterator::~FillPatchIterator(&U_fpi);
  amrex::MultiFab::~MultiFab(&forcing_term);
  return;
}

Assistant:

void
NavierStokesBase::velocity_advection (Real dt)
{
    BL_PROFILE("NavierStokesBase::velocity_advection()");

    if (verbose)
    {
        if (do_mom_diff == 0)
        {

            amrex::Print() << "... advect velocities\n";
        }
        else
        {
            amrex::Print() << "... advect momenta\n";
        }
    }

    const Real  prev_time      = state[State_Type].prevTime();

    MultiFab* divu_fp = getDivCond(nghost_force(),prev_time);

    MultiFab forcing_term( grids, dmap, AMREX_SPACEDIM, nghost_force(), MFInfo(),Factory());
    forcing_term.setVal(0.0);

    FillPatchIterator U_fpi(*this,forcing_term, nghost_state(),prev_time,State_Type,Xvel,AMREX_SPACEDIM);
    MultiFab& Umf=U_fpi.get_mf();

    //
    // S_term is the state we are solving for: either velocity or momentum
    //
    MultiFab* S_term;

    S_term = (do_mom_diff)
        ? new MultiFab( grids, dmap, AMREX_SPACEDIM, nghost_state(), MFInfo(), Factory())
        : &Umf;

    if (do_mom_diff)
    {
        FillPatchIterator Rho_fpi(*this,forcing_term,nghost_state(),prev_time,State_Type,Density,1);
        MultiFab& Rmf=Rho_fpi.get_mf();

        for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
        {
            auto const state_bx = U_mfi.growntilebox(nghost_state());

            auto const& dens = Rmf.const_array(U_mfi); //Previous time, nghost_state() grow cells filled
            auto const& vel  = Umf.const_array(U_mfi);
            auto const& st   = S_term->array(U_mfi);

            amrex::ParallelFor(state_bx, AMREX_SPACEDIM, [ dens, vel, st ]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { st(i,j,k,n) = vel(i,j,k,n) * dens(i,j,k); });
        }
    }

    //
    // Forcing term not used in MOL
    //
    if ( advection_scheme != "MOL" )
    {
        MultiFab& Gp = get_old_data(Gradp_Type);

        FillPatchIterator S_fpi(*this,forcing_term,nghost_force(),prev_time,State_Type,Density,NUM_SCALARS);
        MultiFab& Smf=S_fpi.get_mf();

	// Get divu to time n+1/2
        MultiFab* dsdt    = getDsdt(nghost_force(),prev_time);
        MultiFab::Saxpy(*divu_fp, 0.5*dt, *dsdt, 0, 0, 1, nghost_force());
        delete dsdt;

        MultiFab visc_terms(grids,dmap,AMREX_SPACEDIM,nghost_force(),MFInfo(),Factory());
        if (be_cn_theta != 1.0)
            getViscTerms(visc_terms,Xvel,AMREX_SPACEDIM,prev_time);
        else
            visc_terms.setVal(0.0);


#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
        {

            auto const force_bx = U_mfi.growntilebox(nghost_force()); // Box for forcing term

            if (getForceVerbose)
            {
                amrex::Print() << "---" << '\n'
                               << "B - velocity advection:" << '\n'
                               << "Calling getForce..." << '\n';
            }
            getForce(forcing_term[U_mfi],force_bx,Xvel,AMREX_SPACEDIM,
                     prev_time,Umf[U_mfi],Smf[U_mfi],0,U_mfi);

            //
            // Compute the total forcing.
            //
            auto const& tf   = forcing_term.array(U_mfi,Xvel);
            auto const& visc = visc_terms.const_array(U_mfi,Xvel);
            auto const& gp   = Gp.const_array(U_mfi);
            auto const& rho  = Smf.const_array(U_mfi); //Previous time, nghost_force() grow cells filled

            bool is_convective = do_mom_diff ? false : true;
            amrex::ParallelFor(force_bx, AMREX_SPACEDIM, [ tf, visc, gp, rho, is_convective]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                tf(i,j,k,n) = ( tf(i,j,k,n) + visc(i,j,k,n) - gp(i,j,k,n) );
                if (is_convective)
                    tf(i,j,k,n) /= rho(i,j,k);
            });
        }
    }

    ComputeAofs( Xvel, AMREX_SPACEDIM, *S_term, 0, forcing_term, *divu_fp, true, dt );

    delete divu_fp;
    if (do_mom_diff)
        delete S_term;
}